

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassThrough.cpp
# Opt level: O0

Event * __thiscall PassThrough::update(PassThrough *this,double n_dt)

{
  SpikeEvent *in_RDI;
  undefined8 in_XMM0_Qa;
  int n_multiplicity;
  NoEvent *in_stack_ffffffffffffffe0;
  Event *local_8;
  
  n_multiplicity = (int)((ulong)in_XMM0_Qa >> 0x20);
  if (in_RDI[1].super_Event.type == Spike) {
    local_8 = (Event *)operator_new(0x28);
    SpikeEvent::SpikeEvent(in_RDI,n_multiplicity,(double)in_stack_ffffffffffffffe0);
  }
  else {
    local_8 = (Event *)operator_new(0x18);
    NoEvent::NoEvent(in_stack_ffffffffffffffe0);
  }
  return local_8;
}

Assistant:

Event* PassThrough::update(double n_dt) {
    if(eventType == EventType::Spike) {
        return new SpikeEvent(multiplicity, weight);
    }
    else {
        return new NoEvent();
    }
}